

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_value_type xVar1;
  size_t sVar2;
  bool bVar3;
  bool once_local;
  xpath_stack *stack_local;
  size_t first_local;
  xpath_node_set_raw *ns_local;
  xpath_ast_node *this_local;
  
  sVar2 = xpath_node_set_raw::size(ns);
  if (sVar2 != first) {
    bVar3 = true;
    if (this->_type != '\x11') {
      bVar3 = this->_type == '\x10';
    }
    if (!bVar3) {
      __assert_fail("_type == ast_filter || _type == ast_predicate",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                    ,0x272c,
                    "void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate(xpath_node_set_raw &, size_t, const xpath_stack &, bool)"
                   );
    }
    if ((this->_test == '\x02') || (this->_test == '\x03')) {
      apply_predicate_number_const(ns,first,this->_right,stack);
    }
    else {
      xVar1 = rettype(this->_right);
      if (xVar1 == xpath_type_number) {
        apply_predicate_number(ns,first,this->_right,stack,once);
      }
      else {
        apply_predicate_boolean(ns,first,this->_right,stack,once);
      }
    }
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}